

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O2

void __thiscall
mjs::array_object::put(array_object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  uint32_t uVar2;
  property_attribute a;
  wstring_view local_38;
  
  local_38 = string::view(name);
  bVar1 = object::can_put((object *)this,&local_38);
  if ((bVar1) && (bVar1 = native_object::do_native_put(&this->super_native_object,name,val), !bVar1)
     ) {
    local_38 = string::view(name);
    uVar2 = index_value_from_string(&local_38);
    if (uVar2 != 0xffffffff) {
      if ((this->super_native_object).super_object.extensible_ == false) {
        local_38 = string::view(name);
        a = (*(this->super_native_object).super_object._vptr_object[6])(this);
        bVar1 = is_valid(a);
        if (bVar1) {
          return;
        }
      }
      if (this->length_ <= uVar2) {
        this->length_ = uVar2 + 1;
      }
    }
    object::put((object *)this,name,val,attr);
  }
  return;
}

Assistant:

void put(const string& name, const value& val, property_attribute attr) override {
        if (!can_put(name.view()) || do_native_put(name, val)) {
            return;
        }

        const uint32_t index = index_value_from_string(name.view());
        if (index != invalid_index_value) {
            if (!is_extensible() && is_valid(own_property_attributes(name.view()))) {
                return;
            }
            if (index >= length_) {
                length_ = index + 1;
            }
        }

        object::put(name, val, attr);
    }